

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O3

unique_ptr<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>_>
 __thiscall
so_5::details::make_message_instance_impl<false,so_5::coop_t*>::make<so_5::coop_t*&>
          (make_message_instance_impl<false,so_5::coop_t*> *this,coop_t **args)

{
  coop_t *pcVar1;
  message_t *this_00;
  
  this_00 = (message_t *)operator_new(0x20);
  message_t::message_t(this_00);
  this_00->_vptr_message_t = (_func_int **)&PTR__signal_t_00286ce8;
  pcVar1 = *args;
  *(message_t **)this = this_00;
  this_00[1]._vptr_message_t = (_func_int **)pcVar1;
  return (__uniq_ptr_data<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>,_true,_true>
          )(__uniq_ptr_data<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}